

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O0

Box * __thiscall amrex::BATbndryReg::operator()(BATbndryReg *this,Box *a_bx)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  Box *in_RDX;
  Orientation *in_RSI;
  Box *in_RDI;
  int d;
  IntVect hi;
  IntVect lo;
  IntVect v_1;
  IntVect v;
  int local_274;
  int local_270;
  int local_26c;
  int local_264;
  int local_260;
  int local_25c;
  int local_254;
  int local_250;
  int local_24c;
  int local_23c;
  int local_238;
  int local_234;
  int local_22c;
  int local_228;
  int local_224;
  int local_21c;
  int local_218;
  int local_214;
  IntVect local_1cc;
  long local_1c0;
  int local_1b8;
  IntVect local_1b0;
  Box *local_1a0;
  int local_18c;
  IntVect *local_188;
  int local_17c;
  IntVect *local_178;
  int local_16c;
  IntVect *local_168;
  int local_15c;
  IntVect *local_158;
  Orientation *local_150;
  IntVect *local_148;
  undefined4 local_13c;
  Orientation *local_138;
  undefined4 local_12c;
  Orientation *local_128;
  undefined4 local_11c;
  Orientation *local_118;
  Orientation *local_110;
  IntVect *local_108;
  undefined4 local_fc;
  Orientation *local_f8;
  undefined4 local_ec;
  Orientation *local_e8;
  undefined4 local_dc;
  Orientation *local_d8;
  long local_d0;
  int local_c8;
  Orientation *local_c0;
  IntVect *local_b8;
  undefined8 local_b0;
  int local_a8;
  Orientation *local_a0;
  undefined8 *local_98;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  long local_68;
  int local_60;
  Orientation *local_58;
  IntVect *local_50;
  undefined8 local_48;
  int local_40;
  Orientation *local_38;
  undefined8 *local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_1a0 = in_RDX;
  local_50 = Box::smallEnd(in_RDX);
  local_58 = in_RSI + 2;
  local_20 = local_50->vect[2];
  lVar1 = *(long *)local_50->vect;
  local_30 = &local_48;
  local_48._0_4_ = (int)lVar1;
  local_8 = (int)local_48;
  local_c = local_58->val;
  local_4 = local_8;
  if (local_c != 1) {
    if (local_c == 2) {
      if ((int)local_48 < 0) {
        local_48._0_4_ = (int)local_48 + 1;
        if ((int)local_48 < 1) {
          local_48._0_4_ = -(int)local_48;
        }
        local_214 = -(int)local_48 / 2 + -1;
      }
      else {
        local_214 = (int)local_48 / 2;
      }
      local_4 = local_214;
    }
    else if (local_c == 4) {
      if ((int)local_48 < 0) {
        local_48._0_4_ = (int)local_48 + 1;
        if ((int)local_48 < 1) {
          local_48._0_4_ = -(int)local_48;
        }
        local_218 = -(int)local_48 / 4 + -1;
      }
      else {
        local_218 = (int)local_48 / 4;
      }
      local_4 = local_218;
    }
    else {
      if ((int)local_48 < 0) {
        local_48._0_4_ = (int)local_48 + 1;
        if ((int)local_48 < 1) {
          local_48._0_4_ = -(int)local_48;
        }
        local_21c = -(int)local_48 / local_c + -1;
      }
      else {
        local_21c = (int)local_48 / local_c;
      }
      local_4 = local_21c;
    }
  }
  local_48._4_4_ = (int)((ulong)lVar1 >> 0x20);
  local_14 = local_48._4_4_;
  local_48 = lVar1;
  local_48._0_4_ = local_4;
  local_18 = in_RSI[3].val;
  local_10 = local_14;
  if (local_18 != 1) {
    if (local_18 == 2) {
      if (lVar1 < 0) {
        iVar3 = local_14 + 1;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        local_224 = -iVar3 / 2 + -1;
      }
      else {
        local_224 = local_14 / 2;
      }
      local_10 = local_224;
    }
    else if (local_18 == 4) {
      if (lVar1 < 0) {
        iVar3 = local_14 + 1;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        local_228 = -iVar3 / 4 + -1;
      }
      else {
        local_228 = local_14 / 4;
      }
      local_10 = local_228;
    }
    else {
      if (lVar1 < 0) {
        iVar3 = local_14 + 1;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        local_22c = -iVar3 / local_18 + -1;
      }
      else {
        local_22c = local_14 / local_18;
      }
      local_10 = local_22c;
    }
  }
  local_48._4_4_ = local_10;
  local_24 = in_RSI[4].val;
  local_1c = local_20;
  if (local_24 != 1) {
    if (local_24 == 2) {
      if (local_20 < 0) {
        iVar3 = local_20 + 1;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        local_234 = -iVar3 / 2 + -1;
      }
      else {
        local_234 = local_20 / 2;
      }
      local_1c = local_234;
    }
    else if (local_24 == 4) {
      if (local_20 < 0) {
        iVar3 = local_20 + 1;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        local_238 = -iVar3 / 4 + -1;
      }
      else {
        local_238 = local_20 / 4;
      }
      local_1c = local_238;
    }
    else {
      if (local_20 < 0) {
        iVar3 = local_20 + 1;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        local_23c = -iVar3 / local_24 + -1;
      }
      else {
        local_23c = local_20 / local_24;
      }
      local_1c = local_23c;
    }
  }
  local_40 = local_1c;
  local_60 = local_1c;
  local_68 = local_48;
  local_1b8 = local_1c;
  local_1c0 = local_48;
  local_1b0.vect[2] = local_1c;
  local_1b0.vect[0] = (int)local_48;
  local_1b0.vect[1] = local_48._4_4_;
  local_38 = local_58;
  local_b8 = Box::bigEnd(local_1a0);
  local_c0 = in_RSI + 2;
  local_88 = local_b8->vect[2];
  lVar1 = *(long *)local_b8->vect;
  local_98 = &local_b0;
  local_b0._0_4_ = (int)lVar1;
  local_70 = (int)local_b0;
  local_74 = local_c0->val;
  local_6c = local_70;
  if (local_74 != 1) {
    if (local_74 == 2) {
      if ((int)local_b0 < 0) {
        local_b0._0_4_ = (int)local_b0 + 1;
        if ((int)local_b0 < 1) {
          local_b0._0_4_ = -(int)local_b0;
        }
        local_24c = -(int)local_b0 / 2 + -1;
      }
      else {
        local_24c = (int)local_b0 / 2;
      }
      local_6c = local_24c;
    }
    else if (local_74 == 4) {
      if ((int)local_b0 < 0) {
        local_b0._0_4_ = (int)local_b0 + 1;
        if ((int)local_b0 < 1) {
          local_b0._0_4_ = -(int)local_b0;
        }
        local_250 = -(int)local_b0 / 4 + -1;
      }
      else {
        local_250 = (int)local_b0 / 4;
      }
      local_6c = local_250;
    }
    else {
      if ((int)local_b0 < 0) {
        local_b0._0_4_ = (int)local_b0 + 1;
        if ((int)local_b0 < 1) {
          local_b0._0_4_ = -(int)local_b0;
        }
        local_254 = -(int)local_b0 / local_74 + -1;
      }
      else {
        local_254 = (int)local_b0 / local_74;
      }
      local_6c = local_254;
    }
  }
  local_b0._4_4_ = (int)((ulong)lVar1 >> 0x20);
  local_7c = local_b0._4_4_;
  local_b0 = lVar1;
  local_b0._0_4_ = local_6c;
  local_80 = in_RSI[3].val;
  local_78 = local_7c;
  if (local_80 != 1) {
    if (local_80 == 2) {
      if (lVar1 < 0) {
        iVar3 = local_7c + 1;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        local_25c = -iVar3 / 2 + -1;
      }
      else {
        local_25c = local_7c / 2;
      }
      local_78 = local_25c;
    }
    else if (local_80 == 4) {
      if (lVar1 < 0) {
        iVar3 = local_7c + 1;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        local_260 = -iVar3 / 4 + -1;
      }
      else {
        local_260 = local_7c / 4;
      }
      local_78 = local_260;
    }
    else {
      if (lVar1 < 0) {
        iVar3 = local_7c + 1;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        local_264 = -iVar3 / local_80 + -1;
      }
      else {
        local_264 = local_7c / local_80;
      }
      local_78 = local_264;
    }
  }
  local_b0._4_4_ = local_78;
  local_8c = in_RSI[4].val;
  local_84 = local_88;
  if (local_8c != 1) {
    if (local_8c == 2) {
      if (local_88 < 0) {
        iVar3 = local_88 + 1;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        local_26c = -iVar3 / 2 + -1;
      }
      else {
        local_26c = local_88 / 2;
      }
      local_84 = local_26c;
    }
    else if (local_8c == 4) {
      if (local_88 < 0) {
        iVar3 = local_88 + 1;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        local_270 = -iVar3 / 4 + -1;
      }
      else {
        local_270 = local_88 / 4;
      }
      local_84 = local_270;
    }
    else {
      if (local_88 < 0) {
        iVar3 = local_88 + 1;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        local_274 = -iVar3 / local_8c + -1;
      }
      else {
        local_274 = local_88 / local_8c;
      }
      local_84 = local_274;
    }
  }
  local_a8 = local_84;
  local_c8 = local_84;
  local_d0 = local_b0;
  local_1cc.vect[0] = (int)local_b0;
  local_1cc.vect[1] = local_b0._4_4_;
  local_1cc.vect[2] = local_84;
  local_a0 = local_c0;
  iVar3 = Orientation::coordDir(in_RSI);
  bVar2 = Orientation::isLow(in_RSI);
  if (bVar2) {
    local_1cc.vect[iVar3] = local_1b0.vect[iVar3];
    local_16c = iVar3;
    local_168 = &local_1cc;
    local_15c = iVar3;
    local_158 = &local_1b0;
  }
  else {
    local_1b0.vect[iVar3] = local_1cc.vect[iVar3];
    local_18c = iVar3;
    local_188 = &local_1b0;
    local_17c = iVar3;
    local_178 = &local_1cc;
  }
  local_110 = in_RSI + 5;
  local_108 = &local_1b0;
  local_dc = 0;
  iVar3 = local_1b0.vect[1];
  local_1b0.vect[0] = local_110->val + local_1b0.vect[0];
  local_ec = 1;
  local_1b0.vect[1] = in_RSI[6].val + iVar3;
  local_fc = 2;
  local_1b0.vect[2] = in_RSI[7].val + local_1b0.vect[2];
  local_150 = in_RSI + 8;
  local_148 = &local_1cc;
  local_11c = 0;
  iVar3 = local_1cc.vect[1];
  local_1cc.vect[0] = local_150->val + local_1cc.vect[0];
  local_12c = 1;
  local_1cc.vect[1] = in_RSI[9].val + iVar3;
  local_13c = 2;
  local_1cc.vect[2] = in_RSI[10].val + local_1cc.vect[2];
  local_138 = local_150;
  local_128 = local_150;
  local_118 = local_150;
  local_f8 = local_110;
  local_e8 = local_110;
  local_d8 = local_110;
  Box::Box(in_RDI,&local_1b0,&local_1cc,(IndexType)in_RSI[1].val);
  return in_RDI;
}

Assistant:

Box operator() (const Box& a_bx) const noexcept {
        IntVect lo = amrex::coarsen(a_bx.smallEnd(), m_crse_ratio);
        IntVect hi = amrex::coarsen(a_bx.bigEnd(), m_crse_ratio);
        const int d = m_face.coordDir();
        if (m_face.isLow()) {
            hi[d] = lo[d];
        } else {
            lo[d] = hi[d];
        }
        lo += m_loshft;
        hi += m_hishft;
        return Box(lo,hi,m_typ);
    }